

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

bool __thiscall
flatbuffers::rust::RustGenerator::TableBuilderTypeNeedsLifetime(RustGenerator *this,Type *type)

{
  FullType FVar1;
  Type *type_local;
  RustGenerator *this_local;
  
  FVar1 = anon_unknown_26::GetFullType(type);
  if ((FVar1 < ftStruct) || (FVar1 - ftEnumKey < 3)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TableBuilderTypeNeedsLifetime(const Type &type) const {
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool:
      case ftEnumKey:
      case ftUnionKey:
      case ftUnionValue: {
        return false;
      }
      default: {
        return true;
      }
    }
  }